

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_vector.c
# Opt level: O3

exr_result_t
exr_attr_string_vector_init(exr_context_t ctxt,exr_attr_string_vector_t *sv,int32_t nent)

{
  undefined8 *puVar1;
  exr_result_t eVar2;
  exr_attr_string_t *peVar3;
  char *pcVar4;
  long lVar5;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (sv == (exr_attr_string_vector_t *)0x0) {
    eVar2 = (*ctxt->report_error)(ctxt,3,"Invalid reference to string vector object to assign to");
    return eVar2;
  }
  if (nent < 0) {
    UNRECOVERED_JUMPTABLE = ctxt->print_error;
    pcVar4 = "Received request to allocate negative sized string vector (%d entries)";
  }
  else {
    if ((ulong)((long)nent << 4) >> 0x1f == 0) {
      sv->n_strings = 0;
      sv->alloc_size = 0;
      sv->strings = (exr_attr_string_t *)0x0;
      if (nent == 0) {
        return 0;
      }
      peVar3 = (exr_attr_string_t *)(*ctxt->alloc_fn)((long)nent << 4);
      sv->strings = peVar3;
      if (peVar3 != (exr_attr_string_t *)0x0) {
        sv->n_strings = nent;
        sv->alloc_size = nent;
        lVar5 = 0;
        do {
          puVar1 = (undefined8 *)((long)&sv->strings->length + lVar5);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar5 = lVar5 + 0x10;
        } while ((ulong)(uint)nent << 4 != lVar5);
        return 0;
      }
      eVar2 = (*ctxt->standard_error)(ctxt,1);
      return eVar2;
    }
    UNRECOVERED_JUMPTABLE = ctxt->print_error;
    pcVar4 = "Invalid too large size for string vector (%d entries)";
  }
  eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar4,(ulong)(uint)nent,UNRECOVERED_JUMPTABLE);
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_string_vector_init (
    exr_context_t ctxt, exr_attr_string_vector_t* sv, int32_t nent)
{
    exr_attr_string_vector_t nil   = {0};
    exr_attr_string_t        nils  = {0};
    size_t                   bytes = (size_t) nent * sizeof (exr_attr_string_t);

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!sv)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to string vector object to assign to");

    if (nent < 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Received request to allocate negative sized string vector (%d entries)",
            nent);
    if (bytes > (size_t) INT32_MAX)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid too large size for string vector (%d entries)",
            nent);

    *sv = nil;
    if (bytes > 0)
    {
        sv->strings = (exr_attr_string_t*) ctxt->alloc_fn (bytes);
        if (sv->strings == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        sv->n_strings  = nent;
        sv->alloc_size = nent;
        for (int32_t i = 0; i < nent; ++i)
            *(EXR_CONST_CAST (exr_attr_string_t*, (sv->strings + i))) = nils;
    }

    return EXR_ERR_SUCCESS;
}